

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_ab_mean(double mu,double s,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double mean;
  double beta_pdf;
  double beta_cdf;
  double beta;
  double alpha_pdf;
  double alpha_cdf;
  double alpha;
  double b_local;
  double a_local;
  double s_local;
  double mu_local;
  
  dVar1 = (a - mu) / s;
  dVar2 = (b - mu) / s;
  dVar3 = normal_01_cdf(dVar1);
  dVar4 = normal_01_cdf(dVar2);
  dVar1 = normal_01_pdf(dVar1);
  dVar2 = normal_01_pdf(dVar2);
  return mu + (s * (dVar1 - dVar2)) / (dVar4 - dVar3);
}

Assistant:

double normal_truncated_ab_mean ( double mu, double s, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_AB_MEAN returns the mean of the truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviatione of the
//    parent Normal distribution.
//
//    Input, double A, B, the lower and upper truncation limits.
//
//    Output, double NORMAL_TRUNCATED_AB_MEAN, the mean of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double alpha_pdf;
  double beta;
  double beta_cdf;
  double beta_pdf;
  double mean;

  alpha = ( a - mu ) / s;
  beta = ( b - mu ) / s;

  alpha_cdf = normal_01_cdf ( alpha );
  beta_cdf = normal_01_cdf ( beta  );

  alpha_pdf = normal_01_pdf ( alpha );
  beta_pdf = normal_01_pdf ( beta );

  mean = mu + s * ( alpha_pdf - beta_pdf ) / ( beta_cdf - alpha_cdf );

  return mean;
}